

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.cpp
# Opt level: O0

ostream * operator<<(ostream *dest,__int128_t value)

{
  undefined1 auVar1 [16];
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  ulong in_RDX;
  ulong uVar9;
  ulong in_RSI;
  ostream *in_RDI;
  int len;
  char *d;
  char buffer [128];
  __uint128_t tmp;
  sentry s;
  ulong local_110;
  ulong local_108;
  char *local_f0;
  char local_e8 [128];
  ulong local_68;
  ulong local_60;
  sentry local_48 [16];
  ulong local_38;
  ulong local_30;
  ostream *local_20;
  
  local_38 = in_RSI;
  local_30 = in_RDX;
  local_20 = in_RDI;
  std::ostream::sentry::sentry(local_48,in_RDI);
  bVar2 = std::ostream::sentry::operator_cast_to_bool(local_48);
  if (bVar2) {
    if ((long)local_30 < 0) {
      local_110 = -local_38;
      local_108 = -(ulong)(local_38 != 0) - local_30;
    }
    else {
      local_110 = local_38;
      local_108 = local_30;
    }
    local_68 = local_110;
    local_60 = local_108;
    pcVar3 = std::end<char,128ul>(&local_e8);
    do {
      local_f0 = pcVar3;
      pcVar3 = local_f0 + -1;
      uVar4 = local_60 << 0x3f | local_68 >> 1;
      uVar4 = uVar4 + (local_60 >> 1) + (ulong)CARRY8(uVar4,local_60 >> 1);
      *pcVar3 = "0123456789"
                [(ulong)((uint)local_68 & 1) + (ulong)(uint)((int)uVar4 + (int)(uVar4 / 5) * -5) * 2
                ];
      uVar8 = local_60 >> 1;
      uVar4 = local_60 << 0x3f | local_68 >> 1;
      uVar9 = (uVar4 + uVar8 + (ulong)CARRY8(uVar4,uVar8)) % 5;
      uVar5 = uVar4 - uVar9;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar5;
      local_68 = SUB168(auVar1 * ZEXT816(0xcccccccccccccccd),0);
      local_60 = SUB168(auVar1 * ZEXT816(0xcccccccccccccccd),8) + uVar5 * -0x3333333333333334 +
                 (uVar8 - (uVar4 < uVar9)) * -0x3333333333333333;
    } while (local_68 != 0 || local_60 != 0);
    if ((long)local_30 < 0) {
      local_f0[-2] = '-';
      pcVar3 = local_f0 + -2;
    }
    local_f0 = pcVar3;
    pcVar3 = std::end<char,128ul>(&local_e8);
    pcVar6 = (char *)std::ios::rdbuf();
    lVar7 = std::streambuf::sputn(pcVar6,(long)local_f0);
    if (lVar7 != (int)pcVar3 - (int)local_f0) {
      std::ios::setstate((int)local_20 + (int)*(undefined8 *)(*(long *)local_20 + -0x18));
    }
  }
  std::ostream::sentry::~sentry(local_48);
  return local_20;
}

Assistant:

std::ostream&
operator<<( std::ostream& dest, __int128_t value )
{
    std::ostream::sentry s( dest );
    if ( s ) {
        __uint128_t tmp = value < 0 ? -value : value;
        char buffer[ 128 ];
        char* d = std::end( buffer );
        do
        {
            -- d;
            *d = "0123456789"[ tmp % 10 ];
            tmp /= 10;
        } while ( tmp != 0 );
        if ( value < 0 ) {
            -- d;
            *d = '-';
        }
        int len = std::end( buffer ) - d;
        if ( dest.rdbuf()->sputn( d, len ) != len ) {
            dest.setstate( std::ios_base::badbit );
        }
    }
    return dest;
}